

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O2

char * unescape_word(Curl_easy *data,char *inputbuff)

{
  byte bVar1;
  undefined8 in_RAX;
  byte *pbVar2;
  char *pcVar3;
  byte *pbVar4;
  int iVar5;
  int iVar6;
  int len;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  pcVar3 = (char *)0x0;
  pbVar2 = (byte *)curl_easy_unescape(data,inputbuff,0,&local_14);
  if (pbVar2 != (byte *)0x0) {
    pcVar3 = (char *)(*Curl_cmalloc)((long)local_14 * 2 + 1);
    if (pcVar3 != (char *)0x0) {
      iVar6 = 0;
      pbVar4 = pbVar2;
      while( true ) {
        bVar1 = *pbVar4;
        if (bVar1 == 0) break;
        if (((byte)(bVar1 + 0x81) < 0xa2) ||
           ((iVar5 = iVar6, bVar1 - 0x22 < 0x3b &&
            ((0x400000000000021U >> ((ulong)(bVar1 - 0x22) & 0x3f) & 1) != 0)))) {
          iVar5 = iVar6 + 1;
          pcVar3[iVar6] = '\\';
        }
        iVar6 = iVar5 + 1;
        pcVar3[iVar5] = bVar1;
        pbVar4 = pbVar4 + 1;
      }
      pcVar3[iVar6] = '\0';
    }
    (*Curl_cfree)(pbVar2);
  }
  return pcVar3;
}

Assistant:

static char *unescape_word(struct Curl_easy *data, const char *inputbuff)
{
  char *newp;
  char *dictp;
  char *ptr;
  int len;
  char ch;
  int olen=0;

  newp = curl_easy_unescape(data, inputbuff, 0, &len);
  if(!newp)
    return NULL;

  dictp = malloc(((size_t)len)*2 + 1); /* add one for terminating zero */
  if(dictp) {
    /* According to RFC2229 section 2.2, these letters need to be escaped with
       \[letter] */
    for(ptr = newp;
        (ch = *ptr) != 0;
        ptr++) {
      if((ch <= 32) || (ch == 127) ||
          (ch == '\'') || (ch == '\"') || (ch == '\\')) {
        dictp[olen++] = '\\';
      }
      dictp[olen++] = ch;
    }
    dictp[olen]=0;
  }
  free(newp);
  return dictp;
}